

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

void __thiscall
dense_parameters::set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<dense_parameters>>
          (dense_parameters *this,pair<float,_float> *info)

{
  uint32_t uVar1;
  float *pfVar2;
  float *pfVar3;
  
  uVar1 = this->_stride_shift;
  pfVar2 = this->_begin;
  pfVar3 = pfVar2;
  for (; pfVar2 != pfVar3 + this->_weight_mask + 1; pfVar2 = pfVar2 + (1L << ((byte)uVar1 & 0x3f)))
  {
    *pfVar2 = info->first;
    pfVar2[1] = info->second;
    pfVar3 = this->_begin;
  }
  return;
}

Assistant:

uint32_t stride() const { return 1 << _stride_shift; }